

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-form.c
# Opt level: O2

char * vformat(char *fmt,__va_list_tag *vp)

{
  char *buf;
  size_t sVar1;
  va_list args;
  __va_list_tag local_38;
  
  buf = format_buf;
  if (format_buf == (char *)0x0) {
    format_len = 0x400;
    buf = (char *)mem_zalloc(0x400);
    format_buf = buf;
    *buf = '\0';
  }
  if (fmt != (char *)0x0) {
    while( true ) {
      local_38.reg_save_area = vp->reg_save_area;
      local_38.gp_offset = vp->gp_offset;
      local_38.fp_offset = vp->fp_offset;
      local_38.overflow_arg_area = vp->overflow_arg_area;
      sVar1 = vstrnfmt(buf,format_len,fmt,&local_38);
      buf = format_buf;
      if (sVar1 < format_len - 1) break;
      format_len = format_len * 2;
      buf = (char *)mem_realloc(format_buf,format_len);
      format_buf = buf;
    }
  }
  return buf;
}

Assistant:

char *vformat(const char *fmt, va_list vp)
{
	/* Initial allocation */
	if (!format_buf) {
		format_len = 1024;
		format_buf = mem_zalloc(format_len);
		format_buf[0] = 0;
	}

	/* Null format yields last result */
	if (!fmt) return (format_buf);

	/* Keep going until successful */
	while (1) {
		va_list	args;
		size_t len;

		/* Build the string */
		va_copy(args, vp);
		len = vstrnfmt(format_buf, format_len, fmt, args);
		va_end(args);

		/* Success */
		if (len < format_len-1) break;

		/* Grow the buffer */
		format_len = format_len * 2;
		format_buf = mem_realloc(format_buf, format_len);
	}

	/* Return the new buffer */
	return (format_buf);
}